

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wsntopologybasedenergy.cpp
# Opt level: O0

void __thiscall WSNTopologyBasedEnergy::NodeSentSignalSamePower(WSNTopologyBasedEnergy *this)

{
  bool bVar1;
  int iVar2;
  reference piVar3;
  _InputArray local_190;
  allocator<char> local_171;
  string local_170 [32];
  Scalar local_150;
  WSNNode local_130;
  int local_f4;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Stack_f0;
  int i;
  _InputArray local_e8;
  allocator<char> local_c9;
  string local_c8 [32];
  Scalar local_a8;
  WSNNode local_88;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_40;
  int *local_38;
  undefined1 local_30 [8];
  vector<int,_std::allocator<int>_> _array;
  iterator it;
  WSNTopologyBasedEnergy *this_local;
  
  __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::__normal_iterator
            ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
             &_array.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  SelectServalNode((vector<int,_std::allocator<int>_> *)local_30,this);
  local_38 = (int *)std::vector<int,_std::allocator<int>_>::begin
                              ((vector<int,_std::allocator<int>_> *)local_30);
  _array.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = local_38;
  while( true ) {
    local_40._M_current =
         (int *)std::vector<int,_std::allocator<int>_>::end
                          ((vector<int,_std::allocator<int>_> *)local_30);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       &_array.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,&local_40);
    if (!bVar1) break;
    SelectLeaderID(this);
    piVar3 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                        &_array.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage);
    iVar2 = WSNNode::layer(this->node + *piVar3);
    if (iVar2 == 0) {
      iVar2 = WSNNode::GetNodeID(this->LayerLeaderNode);
      this->node[iVar2].energy = this->node[iVar2].energy - 10.0;
      piVar3 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                         &_array.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
      this->node[*piVar3].energy = this->node[*piVar3].energy - 7.0;
    }
    else {
      piVar3 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                         &_array.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
      iVar2 = WSNNode::layer(this->node + *piVar3);
      if (iVar2 == 1) {
        iVar2 = WSNNode::GetNodeID(this->LayerLeaderNode + 1);
        this->node[iVar2].energy = this->node[iVar2].energy - 10.0;
        piVar3 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                 operator*((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                           &_array.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage);
        this->node[*piVar3].energy = this->node[*piVar3].energy - 7.0;
      }
      else {
        piVar3 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                 operator*((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                           &_array.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage);
        iVar2 = WSNNode::layer(this->node + *piVar3);
        if (iVar2 == 2) {
          iVar2 = WSNNode::GetNodeID(this->LayerLeaderNode + 2);
          this->node[iVar2].energy = this->node[iVar2].energy - 10.0;
          piVar3 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                   operator*((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                             &_array.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage);
          this->node[*piVar3].energy = this->node[*piVar3].energy - 7.0;
        }
        else {
          piVar3 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                   operator*((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                             &_array.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage);
          iVar2 = WSNNode::layer(this->node + *piVar3);
          if (iVar2 == 3) {
            iVar2 = WSNNode::GetNodeID(this->LayerLeaderNode + 3);
            this->node[iVar2].energy = this->node[iVar2].energy - 10.0;
            piVar3 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                     operator*((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                               &_array.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage);
            this->node[*piVar3].energy = this->node[*piVar3].energy - 7.0;
          }
          else {
            iVar2 = WSNNode::GetNodeID(this->LayerLeaderNode + 4);
            this->node[iVar2].energy = this->node[iVar2].energy - 10.0;
            piVar3 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                     operator*((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                               &_array.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage);
            this->node[*piVar3].energy = this->node[*piVar3].energy - 7.0;
          }
        }
      }
    }
    piVar3 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                        &_array.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage);
    WSNNode::WSNNode(&local_88,this->node + *piVar3);
    piVar3 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                        &_array.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage);
    WSNNode::NodeColor(&local_a8,this->node + *piVar3);
    drawCrossNode(this,&this->img,&local_88,&local_a8);
    WSNNode::~WSNNode(&local_88);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_c8,"WSN",&local_c9);
    cv::_InputArray::_InputArray(&local_e8,&this->img);
    cv::imshow(local_c8,&local_e8);
    cv::_InputArray::~_InputArray(&local_e8);
    std::__cxx11::string::~string(local_c8);
    std::allocator<char>::~allocator(&local_c9);
    _Stack_f0 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                operator++((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                           &_array.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage,0);
  }
  for (local_f4 = 0; local_f4 < 5; local_f4 = local_f4 + 1) {
    iVar2 = WSNNode::GetNodeID(this->LayerLeaderNode + local_f4);
    WSNNode::WSNNode(&local_130,this->node + iVar2);
    iVar2 = WSNNode::GetNodeID(this->LayerLeaderNode + local_f4);
    WSNNode::NodeColor(&local_150,this->node + iVar2);
    drawCrossNode(this,&this->img,&local_130,&local_150);
    WSNNode::~WSNNode(&local_130);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_170,"WSN",&local_171);
    cv::_InputArray::_InputArray(&local_190,&this->img);
    cv::imshow(local_170,&local_190);
    cv::_InputArray::~_InputArray(&local_190);
    std::__cxx11::string::~string(local_170);
    std::allocator<char>::~allocator(&local_171);
  }
  if ((this->Test & 1U) == 1) {
    cv::waitKey(400);
  }
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_30);
  return;
}

Assistant:

void WSNTopologyBasedEnergy::NodeSentSignalSamePower()
{
	vector<int>::iterator it;
	vector<int> _array=SelectServalNode();
	for(it=_array.begin();it!=_array.end();it++)
	{
		//选择每层的leader节点
		SelectLeaderID();

		//计算能量变化值
		if(0==node[*it].layer())
		{
			//LayerLeaderNode[0].energy-=1+alpha * DistanceBetweenNodes(LayerLeaderNode[0],Link);
			node[LayerLeaderNode[0].GetNodeID()].energy-=10;
			node[*it].energy-=7;
		}
		else if(1==node[*it].layer())
		{
			//LayerLeaderNode[1].energy-=5;
			node[LayerLeaderNode[1].GetNodeID()].energy-=10;
			node[*it].energy-=7;
		}
		else if(2==node[*it].layer())
		{
			//LayerLeaderNode[2].energy-=5;
			node[LayerLeaderNode[2].GetNodeID()].energy-=10;
			node[*it].energy-=7;
		}

		else if(3==node[*it].layer())
		{
			//LayerLeaderNode[3].energy-=5;
			node[LayerLeaderNode[3].GetNodeID()].energy-=10;
			node[*it].energy-=7;
		}
		else 
		{
			//LayerLeaderNode[4].energy-=5;
			node[LayerLeaderNode[4].GetNodeID()].energy-=10;
			node[*it].energy-=7;
		}

		//不同的能量的节点画不同的颜色
		drawCrossNode(img,node[*it],node[*it].NodeColor());
		imshow("WSN",img);	
	}
	//Leader节点的颜色变化
	for(int i=0;i<LayerNum;i++)
	{
		drawCrossNode(img,node[LayerLeaderNode[i].GetNodeID()],node[LayerLeaderNode[i].GetNodeID()].NodeColor());
		imshow("WSN",img);
	}
	if(true==Test) waitKey(400);   //两次发送的时间间隔
}